

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Map_Time_t * Abc_NtkMapCopyCoRequired(Abc_Ntk_t *pNtk,Abc_Time_t *ppTimes)

{
  Abc_Time_t AVar1;
  uint uVar2;
  Map_Time_t *pMVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  float fVar7;
  
  uVar2 = pNtk->vCos->nSize;
  pMVar3 = (Map_Time_t *)calloc((long)(int)uVar2,0xc);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  pfVar6 = &pMVar3->Worst;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    AVar1 = ppTimes[uVar4];
    ((Map_Time_t *)(pfVar6 + -2))->Rise = AVar1.Rise;
    ((Map_Time_t *)(pfVar6 + -2))->Fall = AVar1.Fall;
    fVar7 = AVar1.Fall;
    if (AVar1.Fall <= AVar1.Rise) {
      fVar7 = AVar1.Rise;
    }
    *pfVar6 = fVar7;
    pfVar6 = pfVar6 + 3;
  }
  free(ppTimes);
  return pMVar3;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCoRequired( Abc_Ntk_t * pNtk, Abc_Time_t * ppTimes )
{
    Map_Time_t * p;
    int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCoNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
    {
        p[i].Fall = ppTimes[i].Fall;
        p[i].Rise = ppTimes[i].Rise;
        p[i].Worst = Abc_MaxFloat( p[i].Fall, p[i].Rise );
    }
    ABC_FREE( ppTimes );
    return p;
}